

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.h
# Opt level: O2

Float __thiscall
pbrt::BVHLightSampler::EvaluateCost(BVHLightSampler *this,LightBounds *b,Bounds3f *bounds,int dim)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar9 [56];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 auVar11 [60];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  Vector3<float> VVar13;
  Tuple3<pbrt::Vector3,_float> local_28;
  
  fVar2 = acosf(b->cosTheta_o);
  fVar3 = acosf(b->cosTheta_e);
  auVar1 = vminss_avx(SUB6416(ZEXT464(0x40490fdb),0),ZEXT416((uint)(fVar2 + fVar3)));
  auVar11 = ZEXT1260(auVar1._4_12_);
  fVar3 = b->cosTheta_o;
  auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar1,ZEXT416((uint)fVar2));
  fVar4 = cosf(auVar12._0_4_);
  fVar6 = b->cosTheta_o;
  auVar9 = (undefined1  [56])0x0;
  VVar13 = Bounds3<float>::Diagonal(bounds);
  local_28.z = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar9;
  local_28._0_8_ = vmovlps_avx(auVar7._0_16_);
  fVar5 = MaxComponentValue<pbrt::Vector3,float>(&local_28);
  auVar9 = extraout_var;
  VVar13 = Bounds3<float>::Diagonal(bounds);
  auVar10._0_4_ = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._4_60_ = auVar11;
  auVar8._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar9;
  if (dim != 0) {
    if (dim == 1) {
      auVar12 = vmovshdup_avx(auVar8._0_16_);
      auVar8 = ZEXT1664(auVar12);
    }
    else {
      auVar8 = ZEXT1664(auVar10._0_16_);
    }
  }
  auVar12._0_12_ = ZEXT812(0);
  auVar12._12_4_ = 0;
  auVar12 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar3 * fVar3)),auVar12);
  auVar12 = vsqrtss_avx(auVar12,auVar12);
  auVar1 = vfmsub213ss_fma(ZEXT416((uint)(auVar1._0_4_ + auVar1._0_4_)),auVar12,ZEXT416((uint)fVar4)
                          );
  auVar1 = vfmadd231ss_fma(auVar1,auVar12,ZEXT416((uint)(fVar2 * -2.0)));
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)((fVar6 + auVar1._0_4_) * 1.5707964)),
                           ZEXT416((uint)(1.0 - fVar3)),ZEXT416(0x40c90fdb));
  fVar3 = b->phi;
  fVar6 = Bounds3<float>::SurfaceArea(&b->bounds);
  return fVar6 * (fVar5 / auVar8._0_4_) * auVar1._0_4_ * fVar3;
}

Assistant:

Float EvaluateCost(const LightBounds &b, const Bounds3f &bounds, int dim) const {
        // Evaluate direction bounds measure for _LightBounds_
        Float theta_o = std::acos(b.cosTheta_o), theta_e = std::acos(b.cosTheta_e);
        Float theta_w = std::min(theta_o + theta_e, Pi);
        Float sinTheta_o = SafeSqrt(1 - Sqr(b.cosTheta_o));
        Float Momega = 2 * Pi * (1 - b.cosTheta_o) +
                       Pi / 2 *
                           (2 * theta_w * sinTheta_o - std::cos(theta_o - 2 * theta_w) -
                            2 * theta_o * sinTheta_o + b.cosTheta_o);

        // Return complete cost estimate for _LightBounds_
        Float Kr = MaxComponentValue(bounds.Diagonal()) / bounds.Diagonal()[dim];
        return b.phi * Momega * Kr * b.bounds.SurfaceArea();
    }